

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

size_t mtbdd_map_count(MTBDDMAP map)

{
  int iVar1;
  undefined8 local_18;
  size_t r;
  MTBDDMAP map_local;
  
  local_18 = 0;
  r = map;
  while( true ) {
    iVar1 = mtbdd_map_isempty(r);
    if (iVar1 != 0) break;
    local_18 = local_18 + 1;
    r = mtbdd_map_next(r);
  }
  return local_18;
}

Assistant:

size_t
mtbdd_map_count(MTBDDMAP map)
{
    size_t r = 0;

    while (!mtbdd_map_isempty(map)) {
        r++;
        map = mtbdd_map_next(map);
    }

    return r;
}